

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::dumpProgramSource
          (CLIntercept *this,cl_program program,uint64_t hash,bool modified,char *singleString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char *ptr;
  int iVar3;
  long lVar4;
  long *plVar5;
  size_t size;
  mapped_type *pmVar6;
  undefined8 uVar7;
  size_type *psVar8;
  pointer unaff_R15;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar10;
  string fileName;
  char numberString [256];
  string local_190;
  pthread_mutex_t *local_170;
  char *local_168;
  cl_program local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  local_170 = (pthread_mutex_t *)&this->m_Mutex;
  local_168 = singleString;
  local_160 = program;
  iVar3 = pthread_mutex_lock(local_170);
  if (iVar3 == 0) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    local_190._M_string_length = 0;
    local_190.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_158);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,local_138,&local_190);
    paVar1 = &local_138[0].field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
    if (modified) {
      std::__cxx11::string::append((char *)&local_190);
    }
    memset(local_138,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      snprintf((char *)local_138,0x100,"%08X",hash & 0xffffffff);
    }
    else {
      snprintf((char *)local_138,0x100,"%04u_%08X",(ulong)this->m_ProgramNumber,hash & 0xffffffff);
    }
    std::__cxx11::string::append((char *)&local_190);
    std::__cxx11::string::append((char *)&local_190);
    std::__cxx11::string::append((char *)&local_190);
    lVar4 = std::__cxx11::string::find((char *)&local_190,0x19d01b,0);
    lVar4 = std::__cxx11::string::find((char *)&local_190,0x19d01b,lVar4 + 1);
    if (lVar4 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_138,(ulong)&local_190);
        mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_138[0]._M_dataplus._M_p);
        }
        lVar4 = std::__cxx11::string::find((char *)&local_190,0x19d01b,lVar4 + 1);
      } while (lVar4 != -1);
    }
    if (local_168 != (char *)0x0) {
      std::operator+(&local_158,"Dumping program to file (inject): ",&local_190);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        uVar9 = (undefined4)*psVar8;
        uVar10 = *(undefined4 *)((long)plVar5 + 0x14);
        local_138[0].field_2._0_8_ = *psVar8;
        local_138[0].field_2._8_4_ = (undefined4)plVar5[3];
        local_138[0].field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
        local_138[0]._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_138[0].field_2._0_8_ = *psVar8;
        uVar9 = extraout_XMM0_Da;
        uVar10 = extraout_XMM0_Db;
        local_138[0]._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_138[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      log(this,(double)CONCAT44(uVar10,uVar9));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      ptr = local_168;
      size = strlen(local_168);
      dumpMemoryToFile(this,&local_190,false,ptr,size);
    }
    pmVar6 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&local_160);
    uVar2 = this->m_ProgramNumber;
    pmVar6->ProgramNumber = uVar2;
    pmVar6->CompileCount = 0;
    this->m_ProgramNumber = uVar2 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_170);
    return;
  }
  uVar7 = std::__throw_system_error(iVar3);
  if (local_138[0]._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  pthread_mutex_unlock(local_170);
  _Unwind_Resume(uVar7);
}

Assistant:

void CLIntercept::dumpProgramSource(
    cl_program program,
    uint64_t hash,
    bool modified,
    const char* singleString )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().DumpProgramSource || config().AutoCreateSPIRV );

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    if( modified )
    {
        fileName += "/Modified";
    }

    // Make the file name.  It will have the form:
    //   CLI_<program number>_<hash>_source.cl
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X",
                (unsigned int)hash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X",
                m_ProgramNumber,
                (unsigned int)hash );
        }

        fileName += "/CLI_";
        fileName += numberString;
        fileName += "_source.cl";
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }
    // Dump the program source to a .cl file.
    if( singleString )
    {
        log( "Dumping program to file (inject): " + fileName + "\n" );
        dumpMemoryToFile(
            fileName,
            false,
            singleString,
            strlen(singleString) );
    }

    SProgramInfo&   programInfo = m_ProgramInfoMap[ program ];
    programInfo.ProgramNumber = m_ProgramNumber;
    programInfo.CompileCount = 0;

    m_ProgramNumber++;
}